

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WriteDumb.cpp
# Opt level: O2

uint32_t WriteBinaryNodeAnim(aiNodeAnim *nd)

{
  uint uVar1;
  aiVectorKey *paVar2;
  aiQuatKey *in;
  uint32_t ofs;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  size_t sVar9;
  aiAnimBehaviour local_38;
  aiAnimBehaviour local_34;
  
  ofs = WriteMagic(0x1238);
  uVar3 = Write<aiString>(&nd->mNodeName);
  uVar4 = Write<unsigned_int>(&nd->mNumPositionKeys);
  uVar5 = Write<unsigned_int>(&nd->mNumRotationKeys);
  uVar6 = Write<unsigned_int>(&nd->mNumScalingKeys);
  local_34 = nd->mPreState;
  uVar7 = Write<unsigned_int>(&local_34);
  local_38 = nd->mPostState;
  uVar8 = Write<unsigned_int>(&local_38);
  uVar3 = uVar8 + uVar7 + uVar6 + uVar5 + uVar4 + uVar3;
  paVar2 = nd->mPositionKeys;
  if (paVar2 != (aiVectorKey *)0x0) {
    uVar1 = nd->mNumPositionKeys;
    if (shortened == true) {
      uVar4 = WriteBounds<aiVectorKey>(paVar2,uVar1);
      uVar3 = uVar3 + uVar4;
    }
    else {
      sVar9 = fwrite(paVar2,1,(ulong)uVar1 * 0x18,(FILE *)out);
      uVar3 = uVar3 + (int)sVar9;
    }
  }
  in = nd->mRotationKeys;
  if (in != (aiQuatKey *)0x0) {
    uVar1 = nd->mNumRotationKeys;
    if (shortened == true) {
      uVar4 = WriteBounds<aiQuatKey>(in,uVar1);
      uVar3 = uVar3 + uVar4;
    }
    else {
      sVar9 = fwrite(in,1,(ulong)uVar1 * 0x18,(FILE *)out);
      uVar3 = uVar3 + (int)sVar9;
    }
  }
  paVar2 = nd->mScalingKeys;
  if (paVar2 != (aiVectorKey *)0x0) {
    uVar1 = nd->mNumScalingKeys;
    if (shortened == true) {
      uVar4 = WriteBounds<aiVectorKey>(paVar2,uVar1);
      uVar3 = uVar3 + uVar4;
    }
    else {
      sVar9 = fwrite(paVar2,1,(ulong)uVar1 * 0x18,(FILE *)out);
      uVar3 = uVar3 + (int)sVar9;
    }
  }
  ChangeInteger(ofs,uVar3);
  return uVar3;
}

Assistant:

uint32_t WriteBinaryNodeAnim(const aiNodeAnim* nd)
{
	uint32_t len = 0, old = WriteMagic(ASSBIN_CHUNK_AINODEANIM);

	len += Write<aiString>(nd->mNodeName);
	len += Write<unsigned int>(nd->mNumPositionKeys);
	len += Write<unsigned int>(nd->mNumRotationKeys);
	len += Write<unsigned int>(nd->mNumScalingKeys);
	len += Write<unsigned int>(nd->mPreState);
	len += Write<unsigned int>(nd->mPostState);

	if (nd->mPositionKeys) {
		if (shortened) {
			len += WriteBounds(nd->mPositionKeys,nd->mNumPositionKeys);

		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(nd->mPositionKeys,1,nd->mNumPositionKeys*sizeof(aiVectorKey),out));
	}
	if (nd->mRotationKeys) {
		if (shortened) {
			len += WriteBounds(nd->mRotationKeys,nd->mNumRotationKeys);

		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(nd->mRotationKeys,1,nd->mNumRotationKeys*sizeof(aiQuatKey),out));
	}
	if (nd->mScalingKeys) {
		if (shortened) {
			len += WriteBounds(nd->mScalingKeys,nd->mNumScalingKeys);

		} // else write as usual
		else len += static_cast<uint32_t>(fwrite(nd->mScalingKeys,1,nd->mNumScalingKeys*sizeof(aiVectorKey),out));
	}

	ChangeInteger(old,len);
	return len;
}